

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O3

CFG * __thiscall
covenant::CycleBreaking<covenant::Sym>::Approximate
          (CFG *__return_storage_ptr__,CycleBreaking<covenant::Sym> *this,CFG *g)

{
  CFG *pCVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> group;
  set<int,_std::less<int>,_std::allocator<int>_> group_set;
  CFGConnect conn;
  vector<int,_std::allocator<int>_> local_108;
  CFG *local_f0;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> local_e8 [8];
  undefined4 local_e0 [2];
  undefined8 local_d8;
  undefined4 *local_d0;
  undefined4 *local_c8;
  undefined8 local_c0;
  CFGConnect local_b8;
  
  local_b8.index = -1;
  local_b8.S.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  local_b8.S.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  local_b8.S.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)0x0;
  local_b8.S.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  local_b8.S.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x0;
  local_b8.S.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  local_b8.S.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_cur = (_Elt_pointer)0x0;
  local_b8.S.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_first = (_Elt_pointer)0x0;
  local_b8.S.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_last = (_Elt_pointer)0x0;
  local_b8.S.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_node = (_Map_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&local_b8.S,0);
  local_b8.groups.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.groups.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.verts.
  super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.groups.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.verts.
  super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.verts.
  super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  CFGConnect::scc(&local_b8,g);
  uVar3 = ((long)local_b8.groups.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_b8.groups.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_f0 = __return_storage_ptr__;
  if ((int)uVar3 != 0) {
    uVar4 = 0;
    do {
      if ((long)(int)uVar3 <= (long)uVar4) {
        __assert_fail("g < (int) groups.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/CFG.h"
                      ,0x409,"const vector<int> &covenant::CFGConnect::group(int)");
      }
      std::vector<int,_std::allocator<int>_>::vector
                (&local_108,
                 local_b8.groups.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar4);
      local_e0[0] = 0;
      local_d8 = 0;
      local_d0 = local_e0;
      local_c0 = 0;
      local_c8 = local_d0;
      if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        uVar3 = 0;
        uVar5 = 1;
        do {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    (local_e8,local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar3);
          bVar2 = uVar5 < (ulong)((long)local_108.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_108.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 2);
          uVar3 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar2);
      }
      bVar2 = isLinearSCC(this,g,&local_108,
                          (set<int,_std::less<int>,_std::allocator<int>_> *)local_e8);
      if (!bVar2) {
        cycle_breaking_transf
                  (this,g,&local_108,(set<int,_std::less<int>,_std::allocator<int>_> *)local_e8);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_e8);
      if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar4 = uVar4 + 1;
      uVar3 = ((long)local_b8.groups.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8.groups.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar4 < (uVar3 & 0xffffffff));
  }
  pCVar1 = local_f0;
  CFG::CFG(local_f0,g);
  CFGConnect::~CFGConnect(&local_b8);
  return pCVar1;
}

Assistant:

CFG Approximate(CFG g)
  {
    CFGConnect conn;
    conn.scc(g);
    // cout << "Mutually recursive groups in the grammar: " << conn << endl;
    for (unsigned int i=0; i < conn.nGroups(); i++)
    {
      vector<int>  group = conn.group(i);
      // For efficient membership queries
      set<int>     group_set;
      for(unsigned j=0; j<group.size(); j++)
        group_set.insert(group[j]);
        
      if (!isLinearSCC(g, group, group_set)) 
        cycle_breaking_transf(g, group, group_set);
    }
    return g;
  }